

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-cubic.c
# Opt level: O2

void cubic_on_sent(quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,int64_t now)

{
  long lVar1;
  long lVar2;
  
  if (((((loss->sentmap).bytes_in_flight <= (ulong)bytes) &&
       (lVar1 = (cc->state).cubic.avoidance_start, lVar1 != 0)) &&
      (lVar2 = (cc->state).cubic.last_sent_time, lVar2 != 0)) && (now - lVar2 != 0 && lVar2 <= now))
  {
    (cc->state).cubic.avoidance_start = (now - lVar2) + lVar1;
  }
  (cc->state).cubic.last_sent_time = now;
  return;
}

Assistant:

static void cubic_on_sent(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, int64_t now)
{
    /* Prevent extreme cwnd growth following an idle period caused by application limit.
     * This fixes the W_cubic/W_est calculations by effectively subtracting the idle period
     * The sender is coming out of quiescence if the current packet is the only one in flight.
     * (see https://github.com/torvalds/linux/commit/30927520dbae297182990bb21d08762bcc35ce1d). */
    if (loss->sentmap.bytes_in_flight <= bytes && cc->state.cubic.avoidance_start != 0 && cc->state.cubic.last_sent_time != 0) {
        int64_t delta = now - cc->state.cubic.last_sent_time;
        if (delta > 0)
            cc->state.cubic.avoidance_start += delta;
    }

    cc->state.cubic.last_sent_time = now;
}